

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraphFlattener::lookupGeometries
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *node)

{
  long lVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  GroupNode *this_00;
  mapped_type *pmVar4;
  Node *in_RDI;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  geometries;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v;
  size_t i_3;
  size_t i_2;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  size_t i_4;
  Transformations *in_stack_00000bb8;
  Ref<embree::SceneGraph::Node> *in_stack_00000bc0;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_00000bc8;
  SceneGraphFlattener *in_stack_00000bd0;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffff9e8;
  Transformations *in_stack_fffffffffffff9f0;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffff9f8;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffffa28;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffffa30;
  undefined4 local_568;
  undefined4 local_564;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  mStack_560;
  _Self local_520;
  _Self local_518 [4];
  mapped_type *local_4f8;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 *local_490;
  undefined8 local_488;
  _Base_ptr p_Stack_480;
  _Base_ptr local_478;
  _Base_ptr p_Stack_470;
  undefined8 local_468;
  _Base_ptr p_Stack_460;
  _Base_ptr local_458;
  _Base_ptr p_Stack_450;
  undefined8 *local_448;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_440;
  undefined8 *local_438;
  _Base_ptr local_430;
  _Base_ptr *local_428;
  _Base_ptr *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  _Base_ptr *local_400;
  ulong local_3f8;
  ulong local_3f0;
  long local_3e8;
  _Base_ptr local_3d0;
  ulong local_3c8;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_3c0;
  undefined8 *local_3b8;
  _Base_ptr local_3b0;
  undefined8 *local_3a8;
  _Base_ptr *local_3a0;
  undefined8 local_380;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_378;
  undefined8 local_370;
  _Base_ptr local_368;
  undefined8 *local_360;
  _Base_ptr local_358;
  _Base_ptr local_350;
  _Base_ptr *local_348;
  _Base_ptr local_340;
  undefined8 *local_338;
  _Base_ptr *local_330;
  undefined8 *local_328;
  _Base_ptr local_320;
  _Base_ptr *local_318;
  _Base_ptr local_310;
  _Base_ptr *local_308;
  _Base_ptr *local_300;
  _Base_ptr *local_2f8;
  undefined8 *local_2f0;
  _Base_ptr local_2e8;
  undefined8 *local_2e0;
  _Base_ptr local_2d8;
  undefined8 *local_2d0;
  _Base_ptr *local_2c8;
  undefined8 *local_2c0;
  _Base_ptr local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  _Base_ptr *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  _Base_ptr local_268;
  undefined8 *local_260;
  _Base_ptr local_258;
  _Base_ptr *local_250;
  _Base_ptr *local_248;
  undefined8 *local_240;
  _Base_ptr local_238;
  _Base_ptr local_230;
  _Base_ptr local_228;
  _Base_ptr local_220;
  _Base_ptr *local_218;
  _Base_ptr local_210;
  _Base_ptr *local_208;
  undefined8 local_1d0;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_1c8;
  _Base_ptr local_1c0;
  long local_1b8;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_1b0;
  GroupNode *local_1a8;
  mapped_type *local_1a0;
  undefined4 *local_198;
  undefined4 *local_190;
  undefined4 *local_188;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_180;
  undefined8 *local_178;
  undefined8 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  local_518[0]._M_node =
       (_Base_ptr)
       std::
       map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
       ::find(in_stack_fffffffffffff9e8,(key_type *)0x2ca6c8);
  local_520._M_node =
       (_Base_ptr)
       std::
       map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
       ::end(in_stack_fffffffffffff9e8);
  bVar2 = std::operator==(local_518,&local_520);
  if (bVar2) {
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::vector((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              *)0x2ca714);
    local_490 = &local_568;
    local_190 = &local_494;
    local_198 = &local_498;
    in_stack_fffffffffffffa28 = &mStack_560;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 0;
    local_178 = &local_4d8;
    local_4d8 = 0x3f800000;
    uStack_4d0 = 0;
    local_90 = &local_4c8;
    local_4c8 = 0x3f80000000000000;
    uStack_4c0 = 0;
    local_d0 = &local_4b8;
    local_4b8 = 0;
    uStack_4b0 = 0x3f800000;
    local_120 = &local_4a8;
    local_4a8 = 0;
    uStack_4a0 = 0x3f80000000000000;
    local_448 = &local_4d8;
    local_410 = &local_488;
    local_330 = &local_478;
    local_338 = &local_468;
    local_300 = &local_458;
    local_488 = 0x3f800000;
    p_Stack_480 = (_Base_ptr)0x0;
    local_290 = &local_4c8;
    local_288 = &local_478;
    local_478 = (_Base_ptr)0x3f80000000000000;
    p_Stack_470 = (_Base_ptr)0x0;
    local_2a0 = &local_4b8;
    local_298 = &local_468;
    local_468 = 0;
    p_Stack_460 = (_Base_ptr)0x3f800000;
    local_408 = &local_4a8;
    local_400 = &local_458;
    local_458 = (_Base_ptr)0x0;
    p_Stack_450 = (_Base_ptr)0x3f80000000000000;
    local_3c8 = 0;
    p_Stack_450 = (_Base_ptr)0x3f80000000000000;
    local_458 = (_Base_ptr)0x0;
    p_Stack_460 = (_Base_ptr)0x3f800000;
    local_468 = 0;
    p_Stack_470 = (_Base_ptr)0x0;
    local_478 = (_Base_ptr)0x3f80000000000000;
    p_Stack_480 = (_Base_ptr)0x0;
    local_488 = 0x3f800000;
    uStack_4a0 = 0x3f80000000000000;
    local_4a8 = 0;
    uStack_4b0 = 0x3f800000;
    local_4b8 = 0;
    uStack_4c0 = 0;
    local_4c8 = 0x3f80000000000000;
    uStack_4d0 = 0;
    local_4d8 = 0x3f800000;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 0;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_564 = 0x3f800000;
    local_568 = 0;
    local_2c = 0;
    local_30 = 0;
    local_34 = 0;
    local_38 = 0x3f800000;
    uStack_40 = 0;
    local_48 = 0x3f800000;
    local_54 = 0x3f800000;
    local_58 = 0;
    local_5c = 0;
    local_60 = 0;
    local_64 = 0;
    local_68 = 0x3f800000;
    local_6c = 0;
    uStack_80 = 0;
    local_88 = 0x3f80000000000000;
    local_94 = 0;
    local_98 = 0x3f800000;
    local_9c = 0;
    local_a0 = 0;
    local_a4 = 0x3f800000;
    local_a8 = 0;
    local_ac = 0;
    uStack_c0 = 0x3f800000;
    local_c8 = 0;
    local_d4 = 0;
    local_d8 = 0;
    local_dc = 0x3f800000;
    local_e8 = &one;
    local_f0 = &one;
    local_f8 = &one;
    local_fc = 0x3f800000;
    local_100 = 0;
    local_104 = 0;
    local_108 = 0;
    uStack_110 = 0x3f80000000000000;
    local_118 = 0;
    local_124 = 0;
    local_128 = 0;
    local_12c = 0;
    local_130 = 0x3f800000;
    local_138 = &embree::zero;
    local_140 = &embree::zero;
    local_148 = &embree::zero;
    local_150 = &embree::zero;
    local_158 = &embree::zero;
    local_160 = &embree::zero;
    local_370 = 1;
    local_380 = 1;
    local_494 = 0;
    local_498 = 0x3f800000;
    local_3d0 = (_Base_ptr)0x1;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mStack_560._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_3e8 = 0;
    local_1d0 = 1;
    in_stack_fffffffffffffa30 = in_stack_fffffffffffffa28;
    local_440 = in_stack_fffffffffffffa28;
    local_418 = local_448;
    local_3c0 = in_stack_fffffffffffffa28;
    local_378 = in_stack_fffffffffffffa28;
    local_360 = local_410;
    local_328 = local_410;
    local_2b0 = local_448;
    local_2a8 = local_410;
    local_280 = local_448;
    local_278 = local_410;
    local_1c8 = in_stack_fffffffffffffa28;
    local_188 = local_490;
    local_180 = in_stack_fffffffffffffa28;
    local_168 = local_178;
    local_50 = local_178;
    p_Var3 = (_Base_ptr)
             alignedMalloc((size_t)in_stack_fffffffffffff9f8,(size_t)in_stack_fffffffffffff9f0);
    (in_stack_fffffffffffffa28->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
    for (local_3f0 = 0;
        local_3f0 <
        *(ulong *)&(in_stack_fffffffffffffa28->_M_t)._M_impl.super__Rb_tree_header._M_header;
        local_3f0 = local_3f0 + 1) {
      local_3b0 = (in_stack_fffffffffffffa28->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                  + local_3f0 * 2;
      local_3b8 = (undefined8 *)(local_3e8 + local_3f0 * 0x40);
      local_318 = &local_3b0->_M_left;
      local_320 = local_3b0 + 1;
      local_308 = &local_3b0[1]._M_left;
      p_Var3 = (_Base_ptr)local_3b8[1];
      *(undefined8 *)local_3b0 = *local_3b8;
      local_3b0->_M_parent = p_Var3;
      local_2d0 = local_3b8 + 2;
      local_2c8 = &local_3b0->_M_left;
      p_Var3 = (_Base_ptr)local_3b8[3];
      *local_2c8 = (_Base_ptr)*local_2d0;
      local_3b0->_M_right = p_Var3;
      local_2e0 = local_3b8 + 4;
      local_2d8 = local_3b0 + 1;
      p_Var3 = (_Base_ptr)local_3b8[5];
      *(undefined8 *)local_2d8 = *local_2e0;
      local_3b0[1]._M_parent = p_Var3;
      local_3a8 = local_3b8 + 6;
      local_3a0 = &local_3b0[1]._M_left;
      p_Var3 = (_Base_ptr)local_3b8[7];
      *local_3a0 = (_Base_ptr)*local_3a8;
      local_3b0[1]._M_right = p_Var3;
      local_368 = local_3b0;
      local_310 = local_3b0;
      local_2f0 = local_3b8;
      local_2e8 = local_3b0;
      local_2c0 = local_3b8;
      local_2b8 = local_3b0;
    }
    for (local_3f8 = *(ulong *)&(in_stack_fffffffffffffa28->_M_t)._M_impl.super__Rb_tree_header.
                                _M_header; local_3f8 < local_3c8; local_3f8 = local_3f8 + 1) {
      local_230 = (in_stack_fffffffffffffa28->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                  + local_3f8 * 2;
      local_218 = &local_230->_M_left;
      local_220 = local_230 + 1;
      local_208 = &local_230[1]._M_left;
      local_228 = local_230;
      local_210 = local_230;
    }
    local_1c0 = (in_stack_fffffffffffffa28->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_1b8 = local_3e8;
    local_1b0 = in_stack_fffffffffffffa28;
    alignedFree(in_stack_fffffffffffff9e8);
    *(ulong *)&(in_stack_fffffffffffffa28->_M_t)._M_impl.super__Rb_tree_header._M_header = local_3c8
    ;
    (in_stack_fffffffffffffa28->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = local_3d0;
    p_Var3 = (in_stack_fffffffffffffa30->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar1 = *(long *)&(in_stack_fffffffffffffa30->_M_t)._M_impl.super__Rb_tree_header._M_header;
    *(long *)&(in_stack_fffffffffffffa30->_M_t)._M_impl.super__Rb_tree_header._M_header = lVar1 + 1;
    local_430 = p_Var3 + lVar1 * 2;
    local_438 = &local_488;
    local_348 = &local_430->_M_left;
    local_350 = local_430 + 1;
    local_2f8 = &local_430[1]._M_left;
    *(undefined8 *)local_430 = local_488;
    local_430->_M_parent = p_Stack_480;
    local_250 = &local_478;
    local_248 = &local_430->_M_left;
    *local_248 = local_478;
    local_430->_M_right = p_Stack_470;
    local_260 = &local_468;
    local_258 = local_430 + 1;
    *(undefined8 *)local_258 = local_468;
    local_430[1]._M_parent = p_Stack_460;
    local_428 = &local_458;
    local_420 = &local_430[1]._M_left;
    *local_420 = local_458;
    local_430[1]._M_right = p_Stack_450;
    local_358 = local_430;
    local_340 = local_430;
    local_270 = local_438;
    local_268 = local_430;
    local_240 = local_438;
    local_238 = local_430;
    convertGeometries(in_stack_00000bd0,in_stack_00000bc8,in_stack_00000bc0,in_stack_00000bb8);
    SceneGraph::Transformations::~Transformations(in_stack_fffffffffffff9f0);
    this_00 = (GroupNode *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_00,in_stack_fffffffffffff9f8);
    pmVar4 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[](in_stack_fffffffffffffa30,(key_type *)in_stack_fffffffffffffa28);
    local_1a8 = this_00;
    local_1a0 = pmVar4;
    if (this_00 != (GroupNode *)0x0) {
      (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])();
    }
    if (pmVar4->ptr != (Node *)0x0) {
      (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar4->ptr = &local_1a8->super_Node;
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::~vector((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
               *)this_00);
  }
  local_4f8 = std::
              map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
              ::operator[](in_stack_fffffffffffffa30,(key_type *)in_stack_fffffffffffffa28);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_4f8->ptr;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> lookupGeometries(Ref<SceneGraph::Node> node)
    {
      if (object_mapping.find(node) == object_mapping.end())
      {
        std::vector<Ref<SceneGraph::Node>> geometries;
        convertGeometries(geometries,node,one);
        object_mapping[node] = new SceneGraph::GroupNode(geometries);
      }
      
      return object_mapping[node];
    }